

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

ssize_t write_iso9660_data(archive_write *a,void *buff,size_t s)

{
  void *pvVar1;
  long lVar2;
  int iVar3;
  size_t s_00;
  long *plVar4;
  size_t ts;
  content_conflict *con;
  size_t ws;
  iso9660_conflict *iso9660;
  size_t s_local;
  void *buff_local;
  archive_write *a_local;
  
  pvVar1 = a->format_data;
  if (*(int *)((long)pvVar1 + 8) < 0) {
    archive_set_error(&a->archive,-1,"Couldn\'t create temporary file");
    return -0x1e;
  }
  con = (content_conflict *)s;
  s_local = (size_t)buff;
  if ((*(int *)((long)pvVar1 + 0x40) != 0) &&
     (0xfffff7ff < *(long *)(*(long *)(*(long *)((long)pvVar1 + 0x10) + 0xb0) + 8) + s)) {
    s_00 = 0xfffff800 - *(long *)(*(long *)(*(long *)((long)pvVar1 + 0x10) + 0xb0) + 8);
    if ((char)(*(char *)((long)pvVar1 + 0x1d8) << 7) < '\0') {
      zisofs_detect_magic(a,buff,s_00);
    }
    if ((char)(*(char *)((long)pvVar1 + 0x1d8) << 6) < '\0') {
      iVar3 = zisofs_write_to_temp(a,buff,s_00);
      if (iVar3 != 0) {
        return -0x1e;
      }
    }
    else {
      iVar3 = wb_write_to_temp(a,buff,s_00);
      if (iVar3 != 0) {
        return -0x1e;
      }
      lVar2 = *(long *)(*(long *)((long)pvVar1 + 0x10) + 0xb0);
      *(size_t *)(lVar2 + 8) = s_00 + *(long *)(lVar2 + 8);
    }
    iVar3 = wb_write_padding_to_temp
                      (a,*(int64_t *)(*(long *)(*(long *)((long)pvVar1 + 0x10) + 0xb0) + 8));
    if (iVar3 != 0) {
      return -0x1e;
    }
    *(int *)(*(long *)(*(long *)((long)pvVar1 + 0x10) + 0xb0) + 0x10) =
         (int)(*(long *)(*(long *)(*(long *)((long)pvVar1 + 0x10) + 0xb0) + 8) + 0x7ff >> 0xb);
    con = (content_conflict *)(s - s_00);
    s_local = (long)buff + s_00;
    plVar4 = (long *)calloc(1,0x20);
    if (plVar4 == (long *)0x0) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate content data");
      return -0x1e;
    }
    *plVar4 = (*(long *)((long)a->format_data + 0x102f0) + 0x10000) -
              *(long *)((long)a->format_data + 0x102e0);
    *(long **)(*(long *)(*(long *)((long)pvVar1 + 0x10) + 0xb0) + 0x18) = plVar4;
    *(long **)(*(long *)((long)pvVar1 + 0x10) + 0xb0) = plVar4;
    *(undefined8 *)((long)pvVar1 + 0x240) = 0;
  }
  if ((char)(*(char *)((long)pvVar1 + 0x1d8) << 7) < '\0') {
    zisofs_detect_magic(a,(void *)s_local,(size_t)con);
  }
  a_local = (archive_write *)s;
  if ((char)(*(char *)((long)pvVar1 + 0x1d8) << 6) < '\0') {
    iVar3 = zisofs_write_to_temp(a,(void *)s_local,(size_t)con);
    if (iVar3 != 0) {
      a_local = (archive_write *)0xffffffffffffffe2;
    }
  }
  else {
    iVar3 = wb_write_to_temp(a,(void *)s_local,(size_t)con);
    if (iVar3 == 0) {
      lVar2 = *(long *)(*(long *)((long)pvVar1 + 0x10) + 0xb0);
      *(long *)(lVar2 + 8) = (long)&con->offset_of_temp + *(long *)(lVar2 + 8);
    }
    else {
      a_local = (archive_write *)0xffffffffffffffe2;
    }
  }
  return (ssize_t)a_local;
}

Assistant:

static ssize_t
write_iso9660_data(struct archive_write *a, const void *buff, size_t s)
{
	struct iso9660 *iso9660 = a->format_data;
	size_t ws;

	if (iso9660->temp_fd < 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Couldn't create temporary file");
		return (ARCHIVE_FATAL);
	}

	ws = s;
	if (iso9660->need_multi_extent &&
	    (iso9660->cur_file->cur_content->size + ws) >=
	      (MULTI_EXTENT_SIZE - LOGICAL_BLOCK_SIZE)) {
		struct content *con;
		size_t ts;

		ts = (size_t)(MULTI_EXTENT_SIZE - LOGICAL_BLOCK_SIZE -
		    iso9660->cur_file->cur_content->size);

		if (iso9660->zisofs.detect_magic)
			zisofs_detect_magic(a, buff, ts);

		if (iso9660->zisofs.making) {
			if (zisofs_write_to_temp(a, buff, ts) != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
		} else {
			if (wb_write_to_temp(a, buff, ts) != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			iso9660->cur_file->cur_content->size += ts;
		}

		/* Write padding. */
		if (wb_write_padding_to_temp(a,
		    iso9660->cur_file->cur_content->size) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);

		/* Compute the logical block number. */
		iso9660->cur_file->cur_content->blocks = (int)
		    ((iso9660->cur_file->cur_content->size
		     + LOGICAL_BLOCK_SIZE -1) >> LOGICAL_BLOCK_BITS);

		/*
		 * Make next extent.
		 */
		ws -= ts;
		buff = (const void *)(((const unsigned char *)buff) + ts);
		/* Make a content for next extent. */
		con = calloc(1, sizeof(*con));
		if (con == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate content data");
			return (ARCHIVE_FATAL);
		}
		con->offset_of_temp = wb_offset(a);
		iso9660->cur_file->cur_content->next = con;
		iso9660->cur_file->cur_content = con;
#ifdef HAVE_ZLIB_H
		iso9660->zisofs.block_offset = 0;
#endif
	}

	if (iso9660->zisofs.detect_magic)
		zisofs_detect_magic(a, buff, ws);

	if (iso9660->zisofs.making) {
		if (zisofs_write_to_temp(a, buff, ws) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
	} else {
		if (wb_write_to_temp(a, buff, ws) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		iso9660->cur_file->cur_content->size += ws;
	}

	return (s);
}